

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_NewFrame(void)

{
  float fVar1;
  double dVar2;
  double current_time;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGui_ImplGlfw_Data *bd;
  ImGuiIO *io;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int *in_stack_ffffffffffffffc8;
  ImVec2 in_stack_ffffffffffffffd0;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ImGui_ImplGlfw_Data *local_10;
  ImGuiIO *local_8;
  
  local_8 = ImGui::GetIO();
  local_10 = ImGui_ImplGlfw_GetBackendData();
  glfwGetWindowSize((GLFWwindow *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  glfwGetFramebufferSize
            ((GLFWwindow *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  ImVec2::ImVec2(&local_28,(float)local_14,(float)local_18);
  local_8->DisplaySize = local_28;
  if ((0 < local_14) && (0 < local_18)) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)local_1c / (float)local_14,
                   (float)local_20 / (float)local_18);
    local_8->DisplayFramebufferScale = in_stack_ffffffffffffffd0;
  }
  dVar2 = glfwGetTime();
  if (local_10->Time <= 0.0) {
    fVar1 = 0.016666668;
  }
  else {
    fVar1 = (float)(dVar2 - local_10->Time);
  }
  local_8->DeltaTime = fVar1;
  local_10->Time = dVar2;
  ImGui_ImplGlfw_UpdateMouseData();
  ImGui_ImplGlfw_UpdateMouseCursor();
  ImGui_ImplGlfw_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd != nullptr && "Did you call ImGui_ImplGlfw_InitForXXX()?");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(bd->Window, &w, &h);
    glfwGetFramebufferSize(bd->Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / (float)w, (float)display_h / (float)h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = bd->Time > 0.0 ? (float)(current_time - bd->Time) : (float)(1.0f / 60.0f);
    bd->Time = current_time;

    ImGui_ImplGlfw_UpdateMouseData();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}